

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  SPIRVariable *var_00;
  SPIRType *pSVar6;
  bool *pbVar7;
  uint *puVar8;
  CompilerError *this_00;
  bool local_2bb;
  spirv_cross local_2b0 [32];
  undefined1 local_290 [40];
  SPIRType target_type;
  allocator local_f9;
  string local_f8 [32];
  spirv_cross local_d8 [32];
  string local_b8 [8];
  string array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  spirv_cross local_68 [8];
  string new_expr;
  bool is_sample_mask;
  bool is_patch;
  bool is_tess;
  bool is_builtin;
  BuiltIn builtin;
  SPIRType *type;
  SPIRVariable *var;
  string *expr_local;
  uint32_t source_id_local;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  if (((((this->backend).force_gl_in_out_block & 1U) != 0) &&
      (expr_local._0_4_ = source_id, expr_local._4_4_ = target_id, _source_id_local = this,
      var_00 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,source_id),
      var_00 != (SPIRVariable *)0x0)) &&
     ((var_00->storage == StorageClassInput || (var_00->storage == StorageClassOutput)))) {
    pSVar6 = Compiler::get_variable_data_type(&this->super_Compiler,var_00);
    bVar2 = VectorView<unsigned_int>::empty(&(pSVar6->array).super_VectorView<unsigned_int>);
    if (!bVar2) {
      uVar5 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,
                         DecorationBuiltIn);
      bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var_00);
      bVar2 = false;
      if (((bVar3) && (bVar2 = true, uVar5 != 1)) && (bVar2 = true, uVar5 != 0)) {
        bVar2 = uVar5 == 0x14;
      }
      bVar3 = Compiler::is_tessellation_shader(&this->super_Compiler);
      bVar4 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var_00->super_IVariant).self.id,DecorationPatch)
      ;
      local_2bb = bVar2 && uVar5 == 0x14;
      if ((!bVar4) && ((bVar2 || (bVar3)))) {
        join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                  (local_68,(char (*) [2])0x5b8878,(uint *)((long)&expr_local + 4),
                   (char (*) [10])"_unrolled");
        (*(this->super_Compiler)._vptr_Compiler[0x1b])
                  (local_88,this,pSVar6,local_68,(ulong)expr_local._4_4_);
        statement<std::__cxx11::string,char_const(&)[2]>(this,local_88,(char (*) [2])0x5b3b6f);
        ::std::__cxx11::string::~string((string *)local_88);
        ::std::__cxx11::string::string(local_b8);
        pbVar7 = VectorView<bool>::back(&(pSVar6->array_size_literal).super_VectorView<bool>);
        if ((*pbVar7 & 1U) == 0) {
          puVar8 = VectorView<unsigned_int>::back(&(pSVar6->array).super_VectorView<unsigned_int>);
          to_expression_abi_cxx11_
                    ((CompilerGLSL *)&target_type.member_name_cache._M_h._M_single_bucket,
                     (uint32_t)this,SUB41(*puVar8,0));
          ::std::__cxx11::string::operator=
                    (local_b8,(string *)&target_type.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string
                    ((string *)&target_type.member_name_cache._M_h._M_single_bucket);
        }
        else {
          puVar8 = VectorView<unsigned_int>::back(&(pSVar6->array).super_VectorView<unsigned_int>);
          convert_to_string<unsigned_int,_0>(local_d8,puVar8);
          ::std::__cxx11::string::operator=(local_b8,(string *)local_d8);
          ::std::__cxx11::string::~string((string *)local_d8);
          puVar8 = VectorView<unsigned_int>::back(&(pSVar6->array).super_VectorView<unsigned_int>);
          if (*puVar8 == 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_f8,"Cannot unroll an array copy from unsized array.",&local_f9);
            CompilerError::CompilerError(this_00,(string *)local_f8);
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                  (this,(char (*) [25])"for (int i = 0; i < int(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (char (*) [8])"); i++)");
        begin_scope(this);
        if ((!bVar2) || (local_2bb)) {
          if (bVar2 && uVar5 == 0x14) {
            SPIRType::SPIRType((SPIRType *)(local_290 + 0x20));
            target_type.super_IVariant._vptr_IVariant._4_4_ = 7;
            uVar1 = *(uint *)&(pSVar6->super_IVariant).field_0xc;
            join<std::__cxx11::string&,char_const(&)[4]>(local_2b0,expr,(char (*) [4])"[i]");
            bitcast_expression((CompilerGLSL *)local_290,(SPIRType *)this,(int)local_290 + 0x20,
                               (string *)(ulong)uVar1);
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,(char (*) [7])"[i] = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_290,(char (*) [2])0x5b3b6f);
            ::std::__cxx11::string::~string((string *)local_290);
            ::std::__cxx11::string::~string((string *)local_2b0);
            SPIRType::~SPIRType((SPIRType *)(local_290 + 0x20));
          }
          else {
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,(char (*) [7])"[i] = ",expr,(char (*) [5])0x5c03d5);
          }
        }
        else {
          statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0x5b3b6f);
        }
        end_scope(this);
        ::std::__cxx11::string::operator=((string *)expr,(string *)local_68);
        ::std::__cxx11::string::~string(local_b8);
        ::std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput && var->storage != StorageClassOutput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) &&
	                  (builtin == BuiltInPointSize ||
	                   builtin == BuiltInPosition ||
	                   builtin == BuiltInSampleMask);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);
	bool is_sample_mask = is_builtin && builtin == BuiltInSampleMask;

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin && !is_sample_mask)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else if (is_sample_mask)
		{
			SPIRType target_type;
			target_type.basetype = SPIRType::Int;
			statement(new_expr, "[i] = ", bitcast_expression(target_type, type.basetype, join(expr, "[i]")), ";");
		}
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = std::move(new_expr);
	}
}